

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
enqueue<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,loop::MessageLoop::TaskInfo*>
          (ImplicitProducer *this,TaskInfo **element)

{
  bool bVar1;
  ImplicitProducer *pIVar2;
  Block *__p;
  TaskInfo **ppTVar3;
  Block *newBlock;
  BlockIndexEntry *idxEntry;
  __int_type_conflict head;
  index_t newTailIndex;
  index_t currentTailIndex;
  TaskInfo **element_local;
  ImplicitProducer *this_local;
  int local_4c;
  memory_order __b_2;
  ImplicitProducer *local_40;
  BlockIndexEntry *local_38;
  memory_order local_30;
  int local_2c;
  memory_order __b_1;
  ulong local_20;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  pIVar2 = this + 0x20;
  local_14 = 0;
  currentTailIndex = (index_t)element;
  element_local = (TaskInfo **)this;
  ___b = pIVar2;
  local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_14 - 1U < 2) {
    local_20 = *(ulong *)pIVar2;
  }
  else if (local_14 == 5) {
    local_20 = *(ulong *)pIVar2;
  }
  else {
    local_20 = *(ulong *)pIVar2;
  }
  newTailIndex = local_20;
  head = local_20 + 1;
  if ((local_20 & 0x1f) == 0) {
    pIVar2 = this + 0x28;
    local_2c = 0;
    ___b_1 = pIVar2;
    local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_2c - 1U < 2) {
      local_38 = *(BlockIndexEntry **)pIVar2;
    }
    else if (local_2c == 5) {
      local_38 = *(BlockIndexEntry **)pIVar2;
    }
    else {
      local_38 = *(BlockIndexEntry **)pIVar2;
    }
    idxEntry = local_38;
    bVar1 = details::circular_less_than<unsigned_long>(newTailIndex,(unsigned_long)local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!details::circular_less_than<index_t>(currentTailIndex, head)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                    ,0x964,
                    "bool moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::enqueue(U &&) [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits, allocMode = moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::CanAlloc, U = loop::MessageLoop::TaskInfo *]"
                   );
    }
    bVar1 = details::circular_less_than<unsigned_long>((unsigned_long)idxEntry,newTailIndex + 0x20);
    if (!bVar1) {
      return false;
    }
    bVar1 = insert_block_index_entry<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                      (this,(BlockIndexEntry **)&newBlock,newTailIndex);
    if (!bVar1) {
      return false;
    }
    __p = requisition_block<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                    (*(ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
                       **)(this + 0x50));
    if (__p == (Block *)0x0) {
      ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::
      ImplicitProducer::rewind_block_index_tail((ImplicitProducer *)this);
      std::
      atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
      ::store((atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
               *)((long)&newBlock->field_0 + 8),(__pointer_type)0x0,memory_order_relaxed);
      return false;
    }
    Block::
    reset_empty<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)0>
              ((Block *)__p);
    std::
    atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
    ::store((atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
             *)((long)&newBlock->field_0 + 8),__p,memory_order_relaxed);
    *(Block **)(this + 0x40) = __p;
  }
  ppTVar3 = ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
            ::Block::operator[](*(Block **)(this + 0x40),newTailIndex);
  *ppTVar3 = *(TaskInfo **)currentTailIndex;
  pIVar2 = this + 0x20;
  ___b_2 = head;
  local_4c = 3;
  local_40 = pIVar2;
  std::operator&(memory_order_release,__memory_order_mask);
  if (local_4c == 3) {
    *(__int_type_conflict *)pIVar2 = ___b_2;
  }
  else if (local_4c == 5) {
    LOCK();
    *(__int_type_conflict *)pIVar2 = ___b_2;
    UNLOCK();
  }
  else {
    *(__int_type_conflict *)pIVar2 = ___b_2;
  }
  return true;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto head = this->headIndex.load(std::memory_order_relaxed);
				assert(!details::circular_less_than<index_t>(currentTailIndex, head));
				if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE) || (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
					return false;
				}
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
				debug::DebugLock lock(mutex);
#endif
				// Find out where we'll be inserting this block in the block index
				BlockIndexEntry* idxEntry;
				if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
					return false;
				}
				
				// Get ahold of a new block
				auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
				if (newBlock == nullptr) {
					rewind_block_index_tail();
					idxEntry->value.store(nullptr, std::memory_order_relaxed);
					return false;
				}
#if MCDBGQ_TRACKMEM
				newBlock->owner = this;
#endif
				newBlock->ConcurrentQueue::Block::template reset_empty<implicit_context>();
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					// May throw, try to insert now before we publish the fact that we have this new block
					MOODYCAMEL_TRY {
						new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						rewind_block_index_tail();
						idxEntry->value.store(nullptr, std::memory_order_relaxed);
						this->parent->add_block_to_free_list(newBlock);
						MOODYCAMEL_RETHROW;
					}
				}
				
				// Insert the new block into the index
				idxEntry->value.store(newBlock, std::memory_order_relaxed);
				
				this->tailBlock = newBlock;
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new (nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}